

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void __thiscall proto2_unittest::TestEagerMessage::~TestEagerMessage(TestEagerMessage *this)

{
  TestEagerMessage *this_local;
  
  ~TestEagerMessage(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TestEagerMessage::~TestEagerMessage() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestEagerMessage)
  SharedDtor(*this);
}